

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase286::run(TestCase286 *this)

{
  bool bVar1;
  uint maxTurnCount;
  char *pcVar2;
  int local_13c;
  bool local_135;
  int local_134;
  bool _kj_shouldLog;
  DebugExpression<unsigned_int_&> DStack_130;
  undefined1 local_128 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  char c;
  char *__end2;
  char *__begin2;
  String *__range2;
  undefined1 local_d8 [4];
  uint lines;
  String trace;
  Promise<void> promise;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase286 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  makeChain((anon_unknown_0 *)&trace.content.disposer,1000);
  maxTurnCount = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  EventLoop::run((EventLoop *)&waitScope.runningStacksPool,maxTurnCount);
  Promise<void>::trace((String *)local_d8,(Promise<void> *)&trace.content.disposer);
  __range2._4_4_ = 0;
  __end2 = String::begin((String *)local_d8);
  pcVar2 = String::end((String *)local_d8);
  for (; __end2 != pcVar2; __end2 = __end2 + 1) {
    _kjCondition._39_1_ = *__end2;
    __range2._4_4_ = (uint)(_kjCondition._39_1_ == '\n') + __range2._4_4_;
  }
  DStack_130 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)((long)&__range2 + 4)
                         );
  local_134 = 5;
  kj::_::DebugExpression<unsigned_int&>::operator<
            ((DebugComparison<unsigned_int_&,_int> *)local_128,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffed0,&local_134);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_128);
  if (!bVar1) {
    local_135 = kj::_::Debug::shouldLog(ERROR);
    while (local_135 != false) {
      local_13c = 5;
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x12e,ERROR,"\"failed: expected \" \"(lines) < (5)\", _kjCondition, lines, 5",
                 (char (*) [31])"failed: expected (lines) < (5)",
                 (DebugComparison<unsigned_int_&,_int> *)local_128,(uint *)((long)&__range2 + 4),
                 &local_13c);
      local_135 = false;
    }
  }
  String::~String((String *)local_d8);
  Promise<void>::~Promise((Promise<void> *)&trace.content.disposer);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, DeepChain3) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = makeChain(1000);

  loop.run();

  auto trace = promise.trace();
  uint lines = 0;
  for (char c: trace) {
    lines += c == '\n';
  }

  // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
  // 2-ish nodes.  We'll give a little room for implementation freedom.
  EXPECT_LT(lines, 5);
}